

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

void batch_del(MppDevBatServ *server,MppDevBatTask *batch)

{
  int iVar1;
  MppDevBatTask *batch_local;
  MppDevBatServ *server_local;
  
  if ((batch == (MppDevBatTask *)0x0) &&
     (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch","batch_del",
                 0xce), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((batch->fill_cnt != 0) &&
     (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch->fill_cnt == 0",
                 "batch_del",0xcf), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  iVar1 = list_empty(&batch->link_tasks);
  if ((iVar1 == 0) &&
     (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "list_empty(&batch->link_tasks)","batch_del",0xd0), (mpp_debug & 0x10000000) != 0))
  {
    abort();
  }
  list_del_init(&batch->link_server);
  mpp_mem_pool_put_f("batch_del",server->batch_pool,batch);
  server->batch_free = server->batch_free + -1;
  if ((mpp_server_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_server","batch del free count %d:%d\n",(char *)0x0,
               (ulong)(uint)server->batch_run,(ulong)(uint)server->batch_free);
  }
  return;
}

Assistant:

void batch_del(MppDevBatServ *server, MppDevBatTask *batch)
{
    mpp_assert(batch);
    mpp_assert(batch->fill_cnt == 0);
    mpp_assert(list_empty(&batch->link_tasks));

    list_del_init(&batch->link_server);

    mpp_mem_pool_put(server->batch_pool, batch);
    server->batch_free--;
    mpp_serv_dbg_flow("batch del free count %d:%d\n", server->batch_run, server->batch_free);
}